

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O1

int * __thiscall
cs::mapping<cs::signal_types,_int>::match(mapping<cs::signal_types,_int> *this,signal_types *k)

{
  size_type sVar1;
  mapped_type_conflict *pmVar2;
  compile_error *this_00;
  string local_38;
  
  sVar1 = std::
          map<cs::signal_types,_int,_std::less<cs::signal_types>,_std::allocator<std::pair<const_cs::signal_types,_int>_>_>
          ::count(&this->mDat,k);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<cs::signal_types,_int,_std::less<cs::signal_types>,_std::allocator<std::pair<const_cs::signal_types,_int>_>_>
             ::at(&this->mDat,k);
    return pmVar2;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Undefined Mapping.","");
  compile_error::compile_error(this_00,&local_38);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}